

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  ColumnNumber CVar1;
  Rep *pRVar2;
  SourceCodeInfo_Location *pSVar3;
  Tokenizer *pTVar4;
  int iVar5;
  int iVar6;
  SourceCodeInfo_Location *pSVar7;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pRVar2 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar5 = (source_code_info->location_).super_RepeatedPtrFieldBase.total_size_;
LAB_0030f452:
    internal::RepeatedPtrFieldBase::Reserve
              (&(source_code_info->location_).super_RepeatedPtrFieldBase,iVar5 + 1);
    pRVar2 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
    iVar5 = pRVar2->allocated_size;
  }
  else {
    iVar6 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
    iVar5 = pRVar2->allocated_size;
    if (iVar6 < iVar5) {
      (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
      pSVar3 = (SourceCodeInfo_Location *)pRVar2->elements[iVar6];
      goto LAB_0030f48d;
    }
    if (iVar5 == (source_code_info->location_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_0030f452;
  }
  pRVar2->allocated_size = iVar5 + 1;
  pSVar3 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                     ((source_code_info->location_).super_RepeatedPtrFieldBase.arena_);
  pRVar2 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  iVar5 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
  (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
  pRVar2->elements[iVar5] = pSVar3;
LAB_0030f48d:
  this->location_ = pSVar3;
  pSVar7 = parent->location_;
  if (pSVar7 != pSVar3) {
    (pSVar3->path_).current_size_ = 0;
    iVar5 = (pSVar7->path_).current_size_;
    if (iVar5 != 0) {
      RepeatedField<int>::Reserve(&pSVar3->path_,iVar5);
      (pSVar3->path_).current_size_ = (pSVar3->path_).current_size_ + (pSVar7->path_).current_size_;
      memcpy((pSVar3->path_).arena_or_elements_,(pSVar7->path_).arena_or_elements_,
             (long)(pSVar7->path_).current_size_ << 2);
      pSVar3 = this->location_;
    }
  }
  pTVar4 = this->parser_->input_;
  iVar5 = (pTVar4->current_).line;
  iVar6 = (pSVar3->span_).current_size_;
  pSVar7 = pSVar3;
  if (iVar6 == (pSVar3->span_).total_size_) {
    RepeatedField<int>::Reserve(&pSVar3->span_,iVar6 + 1);
    iVar6 = (pSVar3->span_).current_size_;
    pTVar4 = this->parser_->input_;
    pSVar7 = this->location_;
  }
  (pSVar3->span_).current_size_ = iVar6 + 1;
  *(int *)((long)(pSVar3->span_).arena_or_elements_ + (long)iVar6 * 4) = iVar5;
  CVar1 = (pTVar4->current_).column;
  iVar5 = (pSVar7->span_).current_size_;
  if (iVar5 == (pSVar7->span_).total_size_) {
    RepeatedField<int>::Reserve(&pSVar7->span_,iVar5 + 1);
    iVar5 = (pSVar7->span_).current_size_;
  }
  (pSVar7->span_).current_size_ = iVar5 + 1;
  *(ColumnNumber *)((long)(pSVar7->span_).arena_or_elements_ + (long)iVar5 * 4) = CVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}